

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

bool __thiscall
GdlNumericExpression::CheckTypeAndUnits(GdlNumericExpression *this,ExpressionType *pexptRet)

{
  ExpressionType EVar1;
  ExpressionType EVar2;
  
  EVar2 = kexptZero;
  if (this->m_nValue != 0) {
    EVar2 = (uint)(this->m_nValue == 1) * 4 + kexptNumber;
  }
  EVar1 = kexptMeas;
  if (this->m_munits == -1) {
    EVar1 = EVar2;
  }
  *pexptRet = EVar1;
  return true;
}

Assistant:

bool GdlNumericExpression::CheckTypeAndUnits(ExpressionType * pexptRet)
{
	if (m_nValue == 0 && m_munits == kmunitNone)
		//	so that 0 can be treated as equivalent to 0m
		*pexptRet = kexptZero;
	else if (m_nValue == 1 && m_munits == kmunitNone)
		*pexptRet = kexptOne;
	else if (m_munits == kmunitNone)
		*pexptRet = kexptNumber;
	else
		*pexptRet = kexptMeas;

	return true;
}